

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O2

ON_EmbeddedFile *
ON_EmbeddedFile::FromModelComponentRef
          (ON_ModelComponentReference *ref,ON_EmbeddedFile *none_return_value)

{
  ON_ModelComponent *p;
  ON_EmbeddedFile *pOVar1;
  
  p = ON_ModelComponentReference::ModelComponent(ref);
  pOVar1 = Cast(&p->super_ON_Object);
  if (pOVar1 == (ON_EmbeddedFile *)0x0) {
    pOVar1 = none_return_value;
  }
  return pOVar1;
}

Assistant:

const ON_EmbeddedFile* ON_EmbeddedFile::FromModelComponentRef(const ON_ModelComponentReference& ref,
                                                              const ON_EmbeddedFile* none_return_value) // Static.
{
  const auto* ef = ON_EmbeddedFile::Cast(ref.ModelComponent());
  if (nullptr != ef)
    return ef;

  return none_return_value;
}